

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O3

bool FOOLElimination::needsElimination(FormulaUnit *unit)

{
  bool bVar1;
  Formula *pFVar2;
  SubformulaIterator sfi;
  SubformulaIterator SStack_38;
  
  Kernel::SubformulaIterator::SubformulaIterator(&SStack_38,unit->_formula);
  do {
    while( true ) {
      bVar1 = Kernel::SubformulaIterator::hasNext(&SStack_38);
      if (!bVar1) goto LAB_006d1e56;
      pFVar2 = Kernel::SubformulaIterator::next(&SStack_38);
      if (pFVar2->_connective == LITERAL) break;
      if (pFVar2->_connective == BOOL_TERM) goto LAB_006d1e56;
    }
  } while ((*(byte *)(*(long *)(pFVar2 + 1) + 0x28) & 8) != 0);
LAB_006d1e56:
  Kernel::SubformulaIterator::~SubformulaIterator(&SStack_38);
  return bVar1;
}

Assistant:

bool FOOLElimination::needsElimination(FormulaUnit* unit) {
  /**
   * Be careful with the difference between FOOLElimination::needsElimination
   * and Property::_hasFOOL!
   *
   * The former checks that the formula has subterms that are not syntactically
   * first-order. That only includes boolean variables, used as formulas,
   * formulas, used as terms, $let and $ite. This check is needed to decide
   * whether any of the transformations from FOOLElimination are yet to be
   * applied.
   *
   * The latter checks if there is an occurrence of any boolean term. This is
   * needed to identify if boolean theory axioms must be added to the search
   * space.
   *
   * For an example, consider the following falsum:
   * tff(1, conjecture, ![X : $o, Y : $o]: (X = Y)).
   *
   * $o will be parsed as $bool, and the equality will be parsed simply as
   * equality between $bool. No transformations from FOOLElimination are needed
   * to be applied here, however, theory axioms are needed to be added. Thus,
   * FOOLElimination::needsElimination should return false for this input,
   * whereas Property::_hasFOOL must be set to true.
   */

  SubformulaIterator sfi(unit->formula());
  while(sfi.hasNext()) {
    Formula* formula = sfi.next();
    switch (formula->connective()) {
      case LITERAL:
        if (!formula->literal()->shared()) {
          return true;
        }
        break;
      case BOOL_TERM:
        return true;
      default:
        break;
    }
  }
  return false;
}